

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O1

void __thiscall Jupiter::Plugin::~Plugin(Plugin *this)

{
  pointer pcVar1;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer __dest;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_00147668;
  (this->super_Rehashable)._vptr_Rehashable = (_func_int **)&PTR_OnRehash_00147758;
  if (g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __n = (long)g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    __dest = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      __n = __n - 8;
      if (*__dest == this) {
        if (__dest + 1 !=
            g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          memmove(__dest,__dest + 1,__n);
        }
        g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != g_plugins.
                       super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  (this->config).super_Config._vptr_Config = (_func_int **)&PTR_read_internal_00147168;
  std::
  unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
  ::~unique_ptr(&(this->config).super_Config.m_sections);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equali,_jessilib::text_hashi,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->config).super_Config.m_table._M_h);
  pcVar1 = (this->config).super_Config.m_name._M_dataplus._M_p;
  paVar2 = &(this->config).super_Config.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  Rehashable::~Rehashable(&this->super_Rehashable);
  return;
}

Assistant:

Jupiter::Plugin::~Plugin() {
	for (auto itr = g_plugins.begin(); itr != g_plugins.end(); ++itr) {
		if (*itr == this) {
			g_plugins.erase(itr);
			break;
		}
	}
}